

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::QuerySolarisProcessor(SystemInformationImplementation *this)

{
  string *__lhs;
  bool bVar1;
  bool bVar2;
  int iVar3;
  SystemInformationImplementation *in_RSI;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = QueryProcessorBySysconf(this);
  if (bVar1) {
    ParseValueFromKStat_abi_cxx11_(&local_40,in_RSI,"-s clock_MHz");
    iVar3 = atoi(local_40._M_dataplus._M_p);
    this->CPUSpeedInMHz = (float)iVar3;
    std::__cxx11::string::~string((string *)&local_40);
    (this->ChipID).Family = 0;
    ParseValueFromKStat_abi_cxx11_(&local_40,in_RSI,"-s cpu_type");
    __lhs = &(this->ChipID).ProcessorName;
    std::__cxx11::string::operator=((string *)__lhs,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    (this->ChipID).Model = 0;
    bVar2 = std::operator!=(__lhs,"i386");
    if (bVar2) {
      std::__cxx11::string::assign((char *)&(this->ChipID).Vendor);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
      FindManufacturer(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return bVar1;
}

Assistant:

bool SystemInformationImplementation::QuerySolarisProcessor()
{
  if (!this->QueryProcessorBySysconf()) {
    return false;
  }

  // Parse values
  this->CPUSpeedInMHz = static_cast<float>(
    atoi(this->ParseValueFromKStat("-s clock_MHz").c_str()));

  // Chip family
  this->ChipID.Family = 0;

  // Chip Model
  this->ChipID.ProcessorName = this->ParseValueFromKStat("-s cpu_type");
  this->ChipID.Model = 0;

  // Chip Vendor
  if (this->ChipID.ProcessorName != "i386") {
    this->ChipID.Vendor = "Sun";
    this->FindManufacturer();
  }

  return true;
}